

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_crt.c
# Opt level: O1

int mbedtls_x509write_crt_set_authority_key_identifier(mbedtls_x509write_cert *ctx)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  uchar *c;
  uchar buf [2068];
  uchar *local_850;
  uchar local_848 [2048];
  uchar local_48 [20];
  uchar local_34 [12];
  
  local_850 = local_34;
  memset(local_848,0,0x814);
  uVar1 = mbedtls_pk_write_pubkey(&local_850,local_848,ctx->issuer_key);
  if (-1 < (int)uVar1) {
    mbedtls_sha1(local_34 + -(ulong)uVar1,(ulong)uVar1,local_48);
    local_850 = local_48;
    uVar2 = mbedtls_asn1_write_len(&local_850,local_848,0x14);
    uVar1 = uVar2;
    if ((-1 < (int)uVar2) &&
       (uVar1 = mbedtls_asn1_write_tag(&local_850,local_848,0x80), -1 < (int)uVar1)) {
      sVar3 = (ulong)uVar2 + (ulong)uVar1 + 0x14;
      uVar2 = mbedtls_asn1_write_len(&local_850,local_848,sVar3);
      uVar1 = uVar2;
      if ((-1 < (int)uVar2) &&
         (uVar1 = mbedtls_asn1_write_tag(&local_850,local_848,'0'), -1 < (int)uVar1)) {
        sVar3 = sVar3 + uVar1 + (ulong)uVar2;
        uVar1 = mbedtls_x509_set_extension(&ctx->extensions,"U\x1d#",3,0,local_34 + -sVar3,sVar3);
      }
    }
  }
  return uVar1;
}

Assistant:

int mbedtls_x509write_crt_set_authority_key_identifier( mbedtls_x509write_cert *ctx )
{
    int ret;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE * 2 + 20]; /* tag, length + 2xMPI */
    unsigned char *c = buf + sizeof(buf);
    size_t len = 0;

    memset( buf, 0, sizeof(buf) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_pk_write_pubkey( &c, buf, ctx->issuer_key ) );

    mbedtls_sha1( buf + sizeof(buf) - len, len, buf + sizeof(buf) - 20 );
    c = buf + sizeof(buf) - 20;
    len = 20;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONTEXT_SPECIFIC | 0 ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                MBEDTLS_ASN1_SEQUENCE ) );

    return mbedtls_x509write_crt_set_extension( ctx, MBEDTLS_OID_AUTHORITY_KEY_IDENTIFIER,
                                   MBEDTLS_OID_SIZE( MBEDTLS_OID_AUTHORITY_KEY_IDENTIFIER ),
                                   0, buf + sizeof(buf) - len, len );
}